

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_2000_2999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case2011(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t __len;
  allocator<char> local_373;
  allocator<char> local_372;
  allocator<char> local_371;
  string local_370;
  string local_350;
  string local_330 [32];
  Expectation local_310;
  Expectation local_258;
  Decl local_1a0;
  Decl local_d8;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_330,"\nstruct\n{\n    enum x y ;\n};\n         ",&local_371);
  Expectation::Expectation(&local_310);
  Decl::Decl(&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"y",&local_372);
  pDVar1 = Decl::Member(&local_1a0,&local_350,FieldDeclaration);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"x",&local_373);
  __len = 6;
  pDVar1 = Ty::Tag(&pDVar1->ty_,&local_370,Enum,None);
  Decl::Decl(&local_d8,pDVar1);
  pEVar2 = Expectation::declaration(&local_310,&local_d8);
  Expectation::Expectation(&local_258,pEVar2);
  bind(this,(int)local_330,(sockaddr *)&local_258,__len);
  Expectation::~Expectation(&local_258);
  Decl::~Decl(&local_d8);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  Decl::~Decl(&local_1a0);
  Expectation::~Expectation(&local_310);
  std::__cxx11::string::~string(local_330);
  return;
}

Assistant:

void DeclarationBinderTester::case2011()
{
    bind(R"(
struct
{
    enum x y ;
};
         )",
         Expectation()
            .declaration(Decl().Member("y", SymbolKind::FieldDeclaration)
                     .ty_.Tag("x", TagTypeKind::Enum)));
}